

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O2

void asm_collectargs(ASMState *as,IRIns *ir,CCallInfo *ci,IRRef *args)

{
  uint uVar1;
  ulong uVar2;
  
  uVar1 = ci->flags & 0xff;
  if ((ci->flags >> 8 & 1) != 0) {
    *args = 0x7fff;
    args = args + 1;
    uVar1 = uVar1 - 1;
  }
  for (uVar2 = (ulong)uVar1; 1 < uVar2; uVar2 = uVar2 - 1) {
    ir = as->ir + (ir->field_0).op1;
    uVar1 = (uint)(ir->field_0).op2;
    if ((ir->field_0).op2 == 0x7fff) {
      uVar1 = 0;
    }
    args[uVar2 - 1] = uVar1;
  }
  uVar1 = 0;
  if ((short)(ir->field_1).op12 != 0x7fff) {
    uVar1 = (ir->field_1).op12;
  }
  *args = uVar1 & 0xffff;
  return;
}

Assistant:

static void asm_collectargs(ASMState *as, IRIns *ir,
			    const CCallInfo *ci, IRRef *args)
{
  uint32_t n = CCI_XNARGS(ci);
  /* Account for split args. */
  lj_assertA(n <= CCI_NARGS_MAX*2, "too many args %d to collect", n);
  if ((ci->flags & CCI_L)) { *args++ = ASMREF_L; n--; }
  while (n-- > 1) {
    ir = IR(ir->op1);
    lj_assertA(ir->o == IR_CARG, "malformed CALL arg tree");
    args[n] = ir->op2 == REF_NIL ? 0 : ir->op2;
  }
  args[0] = ir->op1 == REF_NIL ? 0 : ir->op1;
  lj_assertA(IR(ir->op1)->o != IR_CARG, "malformed CALL arg tree");
}